

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_stfq(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *pTVar2;
  uint uVar3;
  TCGTemp *pTVar4;
  uintptr_t o_1;
  TCGv_i64 arg2;
  TCGv_i64 pTVar5;
  TCGContext_conflict10 *tcg_ctx;
  TCGOpcode opc;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_4;
  TCGv_i64 val;
  uint uVar6;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar6 = ctx->opcode;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x30
                     );
    ctx->access_type = 0x30;
  }
  pTVar4 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar4 - (long)tcg_ctx_00);
  pTVar4 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  val = (TCGv_i64)((long)pTVar4 - (long)tcg_ctx_00);
  pTVar2 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  arg2 = (TCGv_i64)(long)(short)uVar1;
  uVar3 = uVar1 >> 0x10 & 0x1f;
  if (uVar3 == 0) {
    pTVar5 = (TCGv_i64)((ulong)arg2 & 0xffffffff);
    if (ctx->sf_mode != false) {
      pTVar5 = arg2;
    }
    opc = INDEX_op_movi_i64;
LAB_00b8b3d4:
    tcg_gen_op2_ppc64(pTVar2,opc,(TCGArg)(ret + (long)pTVar2),(TCGArg)pTVar5);
  }
  else {
    if ((uVar1 & 0xffff) == 0) {
      pTVar5 = cpu_gpr[uVar3];
      if (ctx->sf_mode != false) {
        if (pTVar5 == ret) goto LAB_00b8b3d9;
        pTVar5 = pTVar5 + (long)pTVar2;
        opc = INDEX_op_mov_i64;
        goto LAB_00b8b3d4;
      }
    }
    else {
      tcg_gen_addi_i64_ppc64(pTVar2,ret,cpu_gpr[uVar3],(int64_t)arg2);
      pTVar5 = ret;
      if (ctx->sf_mode != false) goto LAB_00b8b3d9;
    }
    tcg_gen_ext32u_i64_ppc64(pTVar2,ret,pTVar5);
  }
LAB_00b8b3d9:
  uVar6 = uVar6 >> 0x11;
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)pTVar4,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)(uVar6 & 0x1f0) + 0x12b28);
  tcg_gen_qemu_st_i64_ppc64
            (ctx->uc->tcg_ctx,val,ret,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  pTVar2 = ctx->uc->tcg_ctx;
  tcg_gen_addi_i64_ppc64(pTVar2,ret,ret,8);
  if (ctx->sf_mode == false) {
    tcg_gen_ext32u_i64_ppc64(pTVar2,ret,ret);
  }
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)pTVar4,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)((uVar6 + 0x10 & 0x1f0) + 0x12b28));
  tcg_gen_qemu_st_i64_ppc64
            (ctx->uc->tcg_ctx,val,ret,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(val + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_stfq(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd = rD(ctx->opcode);
    TCGv t0;
    TCGv_i64 t1;
    gen_set_access_type(ctx, ACCESS_FLOAT);
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_imm_index(ctx, t0, 0);
    get_fpr(tcg_ctx, t1, rd);
    gen_qemu_st64_i64(ctx, t1, t0);
    gen_addr_add(ctx, t0, t0, 8);
    get_fpr(tcg_ctx, t1, (rd + 1) % 32);
    gen_qemu_st64_i64(ctx, t1, t0);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}